

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureBarrierTexelBlocksBase::setupRenderPass
          (TextureBarrierTexelBlocksBase *this,int testPass,int renderPass)

{
  int iVar1;
  GLint GVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (renderPass == 0 && testPass == 0) {
    GVar2 = (**(code **)(lVar3 + 0xb48))
                      (*(undefined4 *)
                        &(this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.
                         field_0x7c,"blockSize");
    this->m_blockSizeLoc = GVar2;
    GVar2 = (**(code **)(lVar3 + 0xb48))
                      (*(undefined4 *)
                        &(this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.
                         field_0x7c,"modulo");
    this->m_moduloLoc = GVar2;
  }
  iVar1 = (*(this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.super_TestCase.
            super_TestCase.super_TestNode._vptr_TestNode[0xc])
                    (this,(ulong)(uint)testPass,(ulong)(uint)renderPass);
  if (iVar1 != this->m_blockSize) {
    this->m_blockSize = iVar1;
    (**(code **)(lVar3 + 0x14f0))(this->m_blockSizeLoc,iVar1);
  }
  iVar1 = (*(this->super_TextureBarrierBasicOutline).super_TextureBarrierBaseTest.super_TestCase.
            super_TestCase.super_TestNode._vptr_TestNode[0xd])
                    (this,(ulong)(uint)testPass,(ulong)(uint)renderPass);
  if (iVar1 == this->m_modulo) {
    return;
  }
  this->m_modulo = iVar1;
  (**(code **)(lVar3 + 0x14f0))(this->m_moduloLoc,iVar1);
  return;
}

Assistant:

virtual void setupRenderPass(int testPass, int renderPass)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if ((testPass == 0) && (renderPass == 0))
		{
			// Get the uniform locations in the first pass, reuse it afterwards
			m_blockSizeLoc = gl.getUniformLocation(m_program, "blockSize");
			m_moduloLoc	= gl.getUniformLocation(m_program, "modulo");
		}

		// Update block size if changed
		int newBlockSize = getBlockSize(testPass, renderPass);
		if (newBlockSize != m_blockSize)
		{
			m_blockSize = newBlockSize;
			gl.uniform1i(m_blockSizeLoc, m_blockSize);
		}

		// Update modulo if changed
		int newModulo = getModulo(testPass, renderPass);
		if (newModulo != m_modulo)
		{
			m_modulo = newModulo;
			gl.uniform1i(m_moduloLoc, m_modulo);
		}
	}